

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void Log::setDevice(Device device)

{
  Guard local_18;
  Guard guard;
  Device device_local;
  
  guard._mutex._4_4_ = device;
  Mutex::Guard::Guard(&local_18,&_Log::mutex);
  if (_Log::device != guard._mutex._4_4_) {
    if (_Log::device == syslog) {
      closelog();
    }
    _Log::device = guard._mutex._4_4_;
    if (guard._mutex._4_4_ == syslog) {
      openlog((char *)0x0,0xb,0x18);
    }
  }
  Mutex::Guard::~Guard(&local_18);
  return;
}

Assistant:

void Log::setDevice(Device device)
{
  Mutex::Guard guard(_Log::mutex);
  if(_Log::device != device)
  {
#ifndef _WIN32
    if(_Log::device == Log::syslog)
      ::closelog();
#endif
    _Log::device = device;
#ifndef _WIN32
    if(device == Log::syslog)
      ::openlog(NULL, LOG_CONS|LOG_NDELAY|LOG_PID, LOG_DAEMON);
#endif
  }
}